

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddTexCoord
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pTexCoordIdx,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords)

{
  uint uVar1;
  float fVar2;
  DeadlyImportError *pDVar3;
  aiVector3D *paVar4;
  reference pvVar5;
  reference pvVar6;
  long lVar7;
  X3DImporter *this_00;
  _List_node_base *p_Var8;
  size_t ii;
  ulong uVar9;
  size_type __n;
  uint prim_type;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  undefined1 local_a8 [32];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr_copy;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = (X3DImporter *)&texcoord_arr_copy;
  texcoord_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texcoord_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texcoord_arr_copy.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00,
             (pTexCoords->super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl._M_node._M_size);
  p_Var8 = (_List_node_base *)pTexCoords;
  while (p_Var8 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                   &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var8 != (_List_node_base *)pTexCoords) {
    local_a8._0_8_ = p_Var8[1]._M_next;
    local_a8._8_4_ = 0.0;
    this_00 = (X3DImporter *)&texcoord_arr_copy;
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    emplace_back<aiVector3t<float>>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&texcoord_arr_copy,
               (aiVector3t<float> *)local_a8);
  }
  if ((pTexCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish ==
      (pTexCoordIdx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    GeometryHelper_CoordIdxStr2FacesArr(this_00,pCoordIdx,&faces,&prim_type);
  }
  else {
    GeometryHelper_CoordIdxStr2FacesArr(this_00,pTexCoordIdx,&faces,&prim_type);
    if (faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,
                 "Failed to add texture coordinates to mesh, faces list is empty.",
                 (allocator<char> *)&local_70);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)local_a8);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((long)faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 != (ulong)pMesh->mNumFaces) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_a8,
                 "Texture coordinates faces count must be equal to mesh faces count.",
                 (allocator<char> *)&local_70);
      DeadlyImportError::DeadlyImportError(pDVar3,(string *)local_a8);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  uVar1 = pMesh->mNumVertices;
  uVar9 = (ulong)uVar1 * 0xc;
  paVar4 = (aiVector3D *)operator_new__(uVar9);
  if (uVar1 != 0) {
    uVar9 = uVar9 - 0xc;
    memset(paVar4,0,(uVar9 - uVar9 % 0xc) + 0xc);
  }
  pMesh->mTextureCoords[0] = paVar4;
  pMesh->mNumUVComponents[0] = 2;
  lVar7 = (long)faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_start;
  __n = 0;
  while( true ) {
    if (__n == lVar7 >> 4) {
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector(&faces);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&texcoord_arr_copy.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      return;
    }
    uVar1 = pMesh->mFaces[__n].mNumIndices;
    pvVar5 = std::vector<aiFace,_std::allocator<aiFace>_>::at(&faces,__n);
    if (uVar1 != pvVar5->mNumIndices) break;
    for (uVar9 = 0; uVar9 < pMesh->mFaces[__n].mNumIndices; uVar9 = uVar9 + 1) {
      uVar1 = pMesh->mFaces[__n].mIndices[uVar9];
      pvVar5 = std::vector<aiFace,_std::allocator<aiFace>_>::at(&faces,__n);
      pvVar6 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                         (&texcoord_arr_copy,(ulong)pvVar5->mIndices[uVar9]);
      paVar4 = pMesh->mTextureCoords[0];
      paVar4[uVar1].z = pvVar6->z;
      fVar2 = pvVar6->y;
      paVar4 = paVar4 + uVar1;
      paVar4->x = pvVar6->x;
      paVar4->y = fVar2;
    }
    __n = __n + 1;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  to_string<unsigned_long>(&local_50,__n);
  std::operator+(&local_70,
                 "Number of indices in texture face and mesh face must be equal. Invalid face index: "
                 ,&local_50);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_70,".");
  DeadlyImportError::DeadlyImportError(pDVar3,(string *)local_a8);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void X3DImporter::MeshGeometry_AddTexCoord(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pTexCoordIdx,
								const std::list<aiVector2D>& pTexCoords) const
{
    std::vector<aiVector3D> texcoord_arr_copy;
    std::vector<aiFace> faces;
    unsigned int prim_type;

	// copy list to array because we are need indexed access to normals.
	texcoord_arr_copy.reserve(pTexCoords.size());
	for(std::list<aiVector2D>::const_iterator it = pTexCoords.begin(); it != pTexCoords.end(); ++it)
	{
		texcoord_arr_copy.push_back(aiVector3D((*it).x, (*it).y, 0));
	}

	if(pTexCoordIdx.size() > 0)
	{
		GeometryHelper_CoordIdxStr2FacesArr(pTexCoordIdx, faces, prim_type);
        if ( faces.empty() )
        {
            throw DeadlyImportError( "Failed to add texture coordinates to mesh, faces list is empty." );
        }
        if ( faces.size() != pMesh.mNumFaces )
        {
            throw DeadlyImportError( "Texture coordinates faces count must be equal to mesh faces count." );
        }
	}
	else
	{
		GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
	}

	pMesh.mTextureCoords[0] = new aiVector3D[pMesh.mNumVertices];
	pMesh.mNumUVComponents[0] = 2;
	for(size_t fi = 0, fi_e = faces.size(); fi < fi_e; fi++)
	{
		if(pMesh.mFaces[fi].mNumIndices != faces.at(fi).mNumIndices)
			throw DeadlyImportError("Number of indices in texture face and mesh face must be equal. Invalid face index: " + to_string(fi) + ".");

		for(size_t ii = 0; ii < pMesh.mFaces[fi].mNumIndices; ii++)
		{
			size_t vert_idx = pMesh.mFaces[fi].mIndices[ii];
			size_t tc_idx = faces.at(fi).mIndices[ii];

			pMesh.mTextureCoords[0][vert_idx] = texcoord_arr_copy.at(tc_idx);
		}
	}// for(size_t fi = 0, fi_e = faces.size(); fi < fi_e; fi++)
}